

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O3

void duckdb::StringDecompressFunction<unsigned_long>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  idx_t count;
  uint *puVar2;
  ulong *puVar3;
  unsigned_long *puVar4;
  Allocator *pAVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string_t *psVar7;
  byte bVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  long *plVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [15];
  undefined1 auVar31 [11];
  undefined1 auVar32 [15];
  undefined1 auVar33 [11];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined8 uVar47;
  undefined8 uVar48;
  reference vector;
  VectorBuffer *pVVar49;
  ulong uVar50;
  TemplatedValidityData<unsigned_long> *pTVar51;
  _Head_base<0UL,_unsigned_long_*,_false> _Var52;
  idx_t iVar53;
  idx_t iVar54;
  void *in_R9;
  idx_t idx_in_entry;
  ulong uVar55;
  data_ptr_t pdVar56;
  undefined4 uVar57;
  uint uVar58;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  optional_idx dict_size;
  undefined1 local_b8 [16];
  undefined1 auStack_b4 [52];
  idx_t local_80;
  UnifiedVectorFormat local_78;
  uint7 uVar59;
  ulong uVar64;
  
  local_78.sel._0_4_ = SUB84(state[1]._vptr_ExpressionState,0);
  local_78.sel._4_4_ = (undefined4)((ulong)state[1]._vptr_ExpressionState >> 0x20);
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_78);
  ArenaAllocator::Reset((ArenaAllocator *)(CONCAT44(local_78.sel._4_4_,local_78.sel._0_4_) + 8));
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar1 = vector->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    psVar7 = (string_t *)result->data;
    puVar4 = (unsigned_long *)vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_long,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_>
              (puVar4,psVar7,count,&vector->validity,&result->validity,in_R9,(bool)local_b8[0]);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(vector);
      pVVar49 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
      pAVar5 = pVVar49[1].data.allocator.ptr;
      local_78.sel._0_4_ = SUB84(pAVar5,0);
      local_78.sel._4_4_ = (undefined4)((ulong)pAVar5 >> 0x20);
      if ((pAVar5 != (Allocator *)0xffffffffffffffff) &&
         (iVar53 = optional_idx::GetIndex((optional_idx *)&local_78), iVar53 * 2 <= count)) {
        DictionaryVector::VerifyDictionary(vector);
        pVVar49 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
        if (*(char *)&pVVar49[1]._vptr_VectorBuffer == '\0') {
          psVar7 = (string_t *)result->data;
          puVar4 = (unsigned_long *)pVVar49[1].data.pointer;
          iVar53 = optional_idx::GetIndex((optional_idx *)&local_78);
          FlatVector::VerifyFlatVector((Vector *)(pVVar49 + 1));
          FlatVector::VerifyFlatVector(result);
          UnaryExecutor::
          ExecuteFlat<unsigned_long,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_>
                    (puVar4,psVar7,iVar53,(ValidityMask *)&pVVar49[1].data.allocated_size,
                     &result->validity,in_R9,(bool)local_b8[0]);
          DictionaryVector::VerifyDictionary(vector);
          pVVar49 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
          iVar53 = optional_idx::GetIndex((optional_idx *)&local_78);
          Vector::Dictionary(result,result,iVar53,(SelectionVector *)(pVVar49 + 1),count);
          return;
        }
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar2 = (uint *)result->data;
      puVar3 = (ulong *)vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      uVar55 = *puVar3;
      auVar15._8_6_ = 0;
      auVar15._0_8_ = uVar55;
      auVar15[0xe] = (char)(uVar55 >> 0x38);
      auVar17._8_4_ = 0;
      auVar17._0_8_ = uVar55;
      auVar17[0xc] = (char)(uVar55 >> 0x30);
      auVar17._13_2_ = auVar15._13_2_;
      auVar19._8_4_ = 0;
      auVar19._0_8_ = uVar55;
      auVar19._12_3_ = auVar17._12_3_;
      auVar21._8_2_ = 0;
      auVar21._0_8_ = uVar55;
      auVar21[10] = (char)(uVar55 >> 0x28);
      auVar21._11_4_ = auVar19._11_4_;
      auVar23._8_2_ = 0;
      auVar23._0_8_ = uVar55;
      auVar23._10_5_ = auVar21._10_5_;
      auVar24[8] = (char)(uVar55 >> 0x20);
      auVar24._0_8_ = uVar55;
      auVar24._9_6_ = auVar23._9_6_;
      auVar63[7] = 0;
      auVar63._0_7_ = auVar24._8_7_;
      auVar32._7_8_ = 0;
      auVar32._0_7_ = auVar24._8_7_;
      auVar37._1_8_ = SUB158(auVar32 << 0x40,7);
      auVar37[0] = (char)(uVar55 >> 0x18);
      auVar37._9_6_ = 0;
      auVar33._1_10_ = SUB1510(auVar37 << 0x30,5);
      auVar33[0] = (char)(uVar55 >> 0x10);
      auVar38._11_4_ = 0;
      auVar38._0_11_ = auVar33;
      auVar27._3_12_ = SUB1512(auVar38 << 0x20,3);
      auVar27[2] = (char)(uVar55 >> 8);
      auVar27[1] = 0;
      auVar27[0] = (byte)uVar55;
      auVar63._8_4_ = auVar27._0_4_;
      auVar63._12_4_ = auVar33._0_4_;
      auVar63 = pshuflw(auVar63,auVar63,0x1b);
      auVar63 = pshufhw(auVar63,auVar63,0x1b);
      sVar9 = auVar63._0_2_;
      sVar10 = auVar63._2_2_;
      sVar11 = auVar63._4_2_;
      sVar12 = auVar63._6_2_;
      uVar58 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar63[6] - (0xff < sVar12),
                        CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar63[4] - (0xff < sVar11),
                                 CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar63[2] -
                                          (0xff < sVar10),
                                          (0 < sVar9) * (sVar9 < 0x100) * auVar63[0] -
                                          (0xff < sVar9))));
      sVar9 = auVar63._8_2_;
      sVar10 = auVar63._10_2_;
      sVar11 = auVar63._12_2_;
      *puVar2 = (uint)uVar55 & 0xff;
      puVar2[1] = uVar58;
      *(ulong *)(puVar2 + 2) =
           (ulong)(uint3)(CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar63[0xc] - (0xff < sVar11),
                                   CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar63[10] -
                                            (0xff < sVar10),
                                            CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar63[8] -
                                                     (0xff < sVar9),uVar58))) >> 0x20);
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar56 = result->data;
    plVar28 = (long *)CONCAT44(local_78.sel._4_4_,local_78.sel._0_4_);
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        lVar6 = *plVar28;
        pdVar56 = pdVar56 + 8;
        iVar53 = 0;
        do {
          auVar63 = local_b8;
          iVar54 = iVar53;
          if (lVar6 != 0) {
            iVar54 = (idx_t)*(uint *)(lVar6 + iVar53 * 4);
          }
          uVar55 = *(ulong *)(CONCAT44(local_78.data._4_4_,local_78.data._0_4_) + iVar54 * 8);
          auVar13._8_6_ = 0;
          auVar13._0_8_ = uVar55;
          auVar13[0xe] = (char)(uVar55 >> 0x38);
          auVar14._8_4_ = 0;
          auVar14._0_8_ = uVar55;
          auVar14[0xc] = (char)(uVar55 >> 0x30);
          auVar14._13_2_ = auVar13._13_2_;
          auVar16._8_4_ = 0;
          auVar16._0_8_ = uVar55;
          auVar16._12_3_ = auVar14._12_3_;
          auVar18._8_2_ = 0;
          auVar18._0_8_ = uVar55;
          auVar18[10] = (char)(uVar55 >> 0x28);
          auVar18._11_4_ = auVar16._11_4_;
          auVar20._8_2_ = 0;
          auVar20._0_8_ = uVar55;
          auVar20._10_5_ = auVar18._10_5_;
          auVar22[8] = (char)(uVar55 >> 0x20);
          auVar22._0_8_ = uVar55;
          auVar22._9_6_ = auVar20._9_6_;
          auVar62[7] = 0;
          auVar62._0_7_ = auVar22._8_7_;
          auVar30._7_8_ = 0;
          auVar30._0_7_ = auVar22._8_7_;
          auVar35._1_8_ = SUB158(auVar30 << 0x40,7);
          auVar35[0] = (char)(uVar55 >> 0x18);
          auVar35._9_6_ = 0;
          auVar31._1_10_ = SUB1510(auVar35 << 0x30,5);
          auVar31[0] = (char)(uVar55 >> 0x10);
          auVar36._11_4_ = 0;
          auVar36._0_11_ = auVar31;
          auVar25[2] = (char)(uVar55 >> 8);
          auVar25._0_2_ = (ushort)uVar55;
          auVar25._3_12_ = SUB1512(auVar36 << 0x20,3);
          auVar26._2_13_ = auVar25._2_13_;
          auVar26._0_2_ = (ushort)uVar55 & 0xff;
          auVar62._8_4_ = auVar26._0_4_;
          auVar62._12_4_ = auVar31._0_4_;
          auVar62 = pshuflw(auVar62,auVar62,0x1b);
          auVar62 = pshufhw(auVar62,auVar62,0x1b);
          sVar9 = auVar62._0_2_;
          sVar10 = auVar62._2_2_;
          sVar11 = auVar62._4_2_;
          sVar12 = auVar62._6_2_;
          uVar57 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar62[6] - (0xff < sVar12),
                            CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar62[4] - (0xff < sVar11),
                                     CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar62[2] -
                                              (0xff < sVar10),
                                              (0 < sVar9) * (sVar9 < 0x100) * auVar62[0] -
                                              (0xff < sVar9))));
          sVar9 = auVar62._8_2_;
          sVar10 = auVar62._10_2_;
          sVar11 = auVar62._12_2_;
          uVar59 = CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar62[0xc] - (0xff < sVar11),
                            CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar62[10] - (0xff < sVar10)
                                     ,CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar62[8] -
                                               (0xff < sVar9),uVar57)));
          sVar9 = auVar62._14_2_;
          local_b8[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar62[0xe] - (0xff < sVar9);
          local_b8._0_7_ = uVar59;
          local_b8._8_8_ = auVar63._8_8_;
          auVar62 = local_b8;
          local_b8._12_4_ = auVar63._12_4_;
          local_b8._0_11_ = auVar62._0_11_;
          local_b8[0xb] = 0;
          local_b8._7_4_ = 0;
          *(uint *)(pdVar56 + -8) = (uint)uVar55 & 0xff;
          *(undefined4 *)(pdVar56 + -4) = uVar57;
          *(undefined8 *)pdVar56 = local_b8._4_8_;
          iVar53 = iVar53 + 1;
          pdVar56 = pdVar56 + 0x10;
        } while (count != iVar53);
      }
    }
    else if (count != 0) {
      lVar6 = *plVar28;
      pdVar56 = pdVar56 + 8;
      uVar55 = 0;
      do {
        auVar63 = local_b8;
        uVar50 = uVar55;
        if (lVar6 != 0) {
          uVar50 = (ulong)*(uint *)(lVar6 + uVar55 * 4);
        }
        uVar48 = local_b8._8_8_;
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar50 >> 6]
             >> (uVar50 & 0x3f) & 1) == 0) {
          _Var52._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var52._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&stack0xffffffffffffff48,&local_80);
            uVar47 = local_b8._0_8_;
            local_b8 = (undefined1  [16])0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar47;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar48;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            pTVar51 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var52._M_head_impl =
                 (pTVar51->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var52._M_head_impl;
          }
          bVar8 = (byte)uVar55 & 0x3f;
          _Var52._M_head_impl[uVar55 >> 6] =
               _Var52._M_head_impl[uVar55 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else {
          uVar50 = *(ulong *)(CONCAT44(local_78.data._4_4_,local_78.data._0_4_) + uVar50 * 8);
          auVar34._8_6_ = 0;
          auVar34._0_8_ = uVar50;
          auVar34[0xe] = (char)(uVar50 >> 0x38);
          auVar42._8_4_ = 0;
          auVar42._0_8_ = uVar50;
          auVar42[0xc] = (char)(uVar50 >> 0x30);
          auVar42._13_2_ = auVar34._13_2_;
          auVar43._8_4_ = 0;
          auVar43._0_8_ = uVar50;
          auVar43._12_3_ = auVar42._12_3_;
          auVar44._8_2_ = 0;
          auVar44._0_8_ = uVar50;
          auVar44[10] = (char)(uVar50 >> 0x28);
          auVar44._11_4_ = auVar43._11_4_;
          auVar45._8_2_ = 0;
          auVar45._0_8_ = uVar50;
          auVar45._10_5_ = auVar44._10_5_;
          auVar46[8] = (char)(uVar50 >> 0x20);
          auVar46._0_8_ = uVar50;
          auVar46._9_6_ = auVar45._9_6_;
          uVar64 = CONCAT17(0,auVar46._8_7_);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar64;
          auVar40._1_9_ = SUB169(auVar41 << 0x40,7);
          auVar40[0] = (char)(uVar50 >> 0x18);
          auVar40._10_6_ = 0;
          auVar29._1_11_ = SUB1611(auVar40 << 0x30,5);
          auVar29[0] = (char)(uVar50 >> 0x10);
          auVar39._12_4_ = 0;
          auVar39._0_12_ = auVar29;
          auVar60._3_13_ = SUB1613(auVar39 << 0x20,3);
          auVar60[2] = (char)(uVar50 >> 8);
          auVar60[0] = (byte)uVar50;
          auVar60[1] = 0;
          auVar61._8_4_ = auVar60._0_4_;
          auVar61._0_8_ = uVar64;
          auVar61._12_4_ = auVar29._0_4_;
          auVar62 = pshuflw(auVar61,auVar61,0x1b);
          auVar62 = pshufhw(auVar62,auVar62,0x1b);
          sVar9 = auVar62._0_2_;
          sVar10 = auVar62._2_2_;
          sVar11 = auVar62._4_2_;
          sVar12 = auVar62._6_2_;
          uVar57 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar62[6] - (0xff < sVar12),
                            CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar62[4] - (0xff < sVar11),
                                     CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar62[2] -
                                              (0xff < sVar10),
                                              (0 < sVar9) * (sVar9 < 0x100) * auVar62[0] -
                                              (0xff < sVar9))));
          sVar9 = auVar62._8_2_;
          sVar10 = auVar62._10_2_;
          sVar11 = auVar62._12_2_;
          uVar59 = CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar62[0xc] - (0xff < sVar11),
                            CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar62[10] - (0xff < sVar10)
                                     ,CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar62[8] -
                                               (0xff < sVar9),uVar57)));
          sVar9 = auVar62._14_2_;
          local_b8[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar62[0xe] - (0xff < sVar9);
          local_b8._0_7_ = uVar59;
          auVar62 = local_b8;
          local_b8._12_4_ = auVar63._12_4_;
          local_b8._0_11_ = auVar62._0_11_;
          local_b8[0xb] = 0;
          local_b8._7_4_ = 0;
          *(uint *)(pdVar56 + -8) = (uint)uVar50 & 0xff;
          *(undefined4 *)(pdVar56 + -4) = uVar57;
          *(undefined8 *)pdVar56 = local_b8._4_8_;
        }
        uVar55 = uVar55 + 1;
        pdVar56 = pdVar56 + 0x10;
      } while (count != uVar55);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void StringDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &allocator = ExecuteFunctionState::GetFunctionState(state)->Cast<StringDecompressLocalState>().allocator;
	allocator.Reset();
	UnaryExecutor::Execute<INPUT_TYPE, string_t>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) { return StringDecompress<INPUT_TYPE>(input, allocator); },
	    FunctionErrors::CANNOT_ERROR);
}